

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O0

void __thiscall
crnlib::dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(dxt5_endpoint_optimizer *this)

{
  undefined8 *in_RDI;
  uint in_stack_ffffffffffffffec;
  vector<unsigned_int> *in_stack_fffffffffffffff0;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 2));
  vector<unsigned_int>::vector((vector<unsigned_int> *)(in_RDI + 4));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 6));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 8));
  sparse_bit_array::sparse_bit_array((sparse_bit_array *)(in_RDI + 0x8a));
  vector<unsigned_char>::reserve
            ((vector<unsigned_char> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  vector<unsigned_int>::reserve(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  return;
}

Assistant:

dxt5_endpoint_optimizer::dxt5_endpoint_optimizer()
    : m_pParams(NULL),
      m_pResults(NULL) {
  m_unique_values.reserve(16);
  m_unique_value_weights.reserve(16);
}